

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O0

Error asmjit::v1_14::VirtMem::releaseDualMapping(DualMapping *dm,size_t size)

{
  Error EVar1;
  size_t in_RSI;
  DualMapping *in_RDI;
  
  EVar1 = unmapDualMapping(in_RDI,in_RSI);
  return EVar1;
}

Assistant:

Error releaseDualMapping(DualMapping* dm, size_t size) noexcept {
#if defined(ASMJIT_NO_DUAL_MAPPING)
  DebugUtils::unused(dm, size);
  return DebugUtils::errored(kErrorFeatureNotEnabled);
#else
  return unmapDualMapping(dm, size);
#endif // ASMJIT_NO_DUAL_MAPPING
}